

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

uchar * format_from_rgba(uint32_t *data,uint pixels,format_t format)

{
  uint uVar1;
  uint uVar2;
  uint16_t *out16;
  uchar a;
  uchar b;
  uchar g;
  uchar r;
  uchar *data8;
  uchar *out;
  uint i;
  format_t format_local;
  uint pixels_local;
  uint32_t *data_local;
  
  if (format == FORMAT_GRAY8) {
    data8 = (uchar *)malloc((ulong)pixels);
    for (out._4_4_ = 0; out._4_4_ < pixels; out._4_4_ = out._4_4_ + 1) {
      data8[out._4_4_] = (uchar)data[out._4_4_];
    }
  }
  else if (format == FORMAT_BGRA8888) {
    data8 = (uchar *)malloc((ulong)pixels << 2);
    for (out._4_4_ = 0; out._4_4_ < pixels; out._4_4_ = out._4_4_ + 1) {
      data8[(ulong)out._4_4_ * 4] = *(uchar *)((long)data + (ulong)out._4_4_ * 4 + 2);
      data8[(ulong)out._4_4_ * 4 + 1] = *(uchar *)((long)data + (ulong)out._4_4_ * 4 + 1);
      data8[(ulong)out._4_4_ * 4 + 2] = (uchar)data[out._4_4_];
      data8[(ulong)out._4_4_ * 4 + 3] = *(uchar *)((long)data + (ulong)out._4_4_ * 4 + 3);
    }
  }
  else if (format == FORMAT_ARGB4444) {
    data8 = (uchar *)malloc((ulong)pixels << 1);
    for (out._4_4_ = 0; out._4_4_ < pixels; out._4_4_ = out._4_4_ + 1) {
      uVar1 = data[out._4_4_];
      uVar2 = data[out._4_4_];
      data8[(ulong)out._4_4_ * 2] =
           (char)((ulong)(((data[out._4_4_] & 0xff00) >> 8) + 8) / 0x11) << 4 |
           (byte)((ulong)(((data[out._4_4_] & 0xff0000) >> 0x10) + 8) / 0x11);
      data8[(ulong)out._4_4_ * 2 + 1] =
           (char)((ulong)((uVar1 >> 0x18) + 8) / 0x11) << 4 |
           (byte)((ulong)((uVar2 & 0xff) + 8) / 0x11);
    }
  }
  else if (format == FORMAT_RGB565) {
    data8 = (uchar *)malloc((ulong)pixels << 1);
    for (out._4_4_ = 0; out._4_4_ < pixels; out._4_4_ = out._4_4_ + 1) {
      *(ushort *)(data8 + (ulong)out._4_4_ * 2) =
           (ushort)((data[out._4_4_] & 0xf8) << 8) | (ushort)((data[out._4_4_] & 0xfc00) >> 5) |
           ((ushort)(data[out._4_4_] >> 0x10) & 0xf8) >> 3;
    }
  }
  else {
    if (format != 0xffffffff) {
      fprintf(_stderr,"%s: unknown format: %u\n",argv0,(ulong)format);
      abort();
    }
    data8 = (uchar *)malloc((ulong)pixels << 2);
    memcpy(data8,data,(ulong)pixels << 2);
  }
  return data8;
}

Assistant:

unsigned char*
format_from_rgba(
    const uint32_t* data,
    unsigned int pixels,
    format_t format)
{
    unsigned int i;
    unsigned char* out = NULL;

    if (format == FORMAT_GRAY8) {
        out = malloc(pixels);
        for (i = 0; i < pixels; ++i) {
            out[i] = data[i] & 0xff;
        }
    } else if (format == FORMAT_BGRA8888) {
        const unsigned char* data8 = (const unsigned char*)data;
        out = malloc(sizeof(uint32_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            out[i * sizeof(uint32_t) + 0] = data8[i * sizeof(uint32_t) + 2];
            out[i * sizeof(uint32_t) + 1] = data8[i * sizeof(uint32_t) + 1];
            out[i * sizeof(uint32_t) + 2] = data8[i * sizeof(uint32_t) + 0];
            out[i * sizeof(uint32_t) + 3] = data8[i * sizeof(uint32_t) + 3];
        }
    } else if (format == FORMAT_ARGB4444) {
        out = malloc(sizeof(uint16_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            /* Use the extra precision for rounding. */
            const unsigned char r = (((data[i] & 0xff000000) >> 24) + 8) / 17;
            const unsigned char g = (((data[i] &   0xff0000) >> 16) + 8) / 17;
            const unsigned char b = (((data[i] &     0xff00) >>  8) + 8) / 17;
            const unsigned char a = (((data[i] &       0xff)      ) + 8) / 17;

            out[i * sizeof(uint16_t) + 0] = (b << 4) | g;
            out[i * sizeof(uint16_t) + 1] = (r << 4) | a;
        }
    } else if (format == FORMAT_RGB565) {
        uint16_t* out16;
        out = malloc(sizeof(uint16_t) * pixels);
        out16 = (uint16_t*)out;
        for (i = 0; i < pixels; ++i) {
                     /* 00000000 00000000 11111000 -> 00000000 00011111 */
            out16[i] = ((data[i] &     0xf8) << 8)
                     /* 00000000 11111100 00000000 -> 00000111 11100000 */
                     | ((data[i] &   0xfc00) >> 5)
                     /* 11111000 00000000 00000000 -> 11111000 00000000 */
                     | ((data[i] & 0xf80000) >>19);
        }
    } else if (format == FORMAT_RGBA8888) {
        out = malloc(sizeof(uint32_t) * pixels);
        memcpy(out, data, sizeof(uint32_t) * pixels);
    } else {
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        abort();
    }

    return out;
}